

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O1

void __thiscall agge::tests::LayoutTests::TrivialLineFeedsDoNotProduceEmptyLines(LayoutTests *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  void *pvVar3;
  long lVar4;
  uint *puVar5;
  factory_ptr f;
  layout l;
  char_to_index indices [4];
  int local_4d4 [13];
  undefined1 local_4a0 [4];
  float fStack_49c;
  float local_498;
  undefined4 uStack_494;
  undefined1 local_490 [16];
  iterator local_480;
  positioned_glyph *ppStack_478;
  bool local_470;
  undefined1 local_468 [16];
  vector<int,_std::allocator<int>_> local_458;
  vector<int,_std::allocator<int>_> local_440;
  vector<int,_std::allocator<int>_> local_428;
  vector<int,_std::allocator<int>_> local_410;
  vector<int,_std::allocator<int>_> local_3f8;
  vector<int,_std::allocator<int>_> local_3e0;
  vector<int,_std::allocator<int>_> local_3c8;
  vector<int,_std::allocator<int>_> local_3b0;
  vector<int,_std::allocator<int>_> local_398;
  vector<int,_std::allocator<int>_> local_380;
  vector<int,_std::allocator<int>_> local_368;
  vector<int,_std::allocator<int>_> local_350;
  vector<int,_std::allocator<int>_> local_338;
  undefined1 local_320 [4];
  float fStack_31c;
  float fStack_318;
  undefined1 local_310 [24];
  vector<int,_std::allocator<int>_> local_2f8;
  vector<int,_std::allocator<int>_> local_2d8;
  vector<int,_std::allocator<int>_> local_2c0;
  vector<int,_std::allocator<int>_> local_2a8;
  int local_290 [2];
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_288;
  undefined1 local_270 [32];
  undefined1 local_250 [24];
  _Alloc_hider local_238;
  char local_228 [32];
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_208;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_1f0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_1d8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_1c0;
  string local_1a8;
  layout local_188;
  ref_text_line local_138;
  ref_text_line local_110;
  glyph local_e8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_e8.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x200000042;
  local_e8.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x300000043;
  local_e8.metrics.dx = 1.58101006669199e-322;
  local_e8.metrics.dy = 2.12199582307954e-314;
  local_e8.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x401c666666666666;
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = 0;
  uStack_a8 = 0;
  local_a0 = 0x4026000000000000;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0x402a000000000000;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0x4031000000000000;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)local_468,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm1,(glyph (*) [4])&local_e8);
  local_188._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (text_line *)0x0;
  local_188._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (text_line *)0x0;
  local_188._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._glyphs._limit = (positioned_glyph *)0x0;
  local_188._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188._glyphs._begin = (positioned_glyph *)0x0;
  local_188._glyphs._end = (positioned_glyph *)0x0;
  local_188._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _local_4a0 = local_490;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4a0,"ABC CBA AB\n\n\nABB BBC\n\n","");
  R((richtext_t *)local_270,(string *)local_4a0);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_188,local_270,local_468._0_8_);
  if (local_238._M_p != local_228) {
    operator_delete(local_238._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector((vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
             *)local_250);
  if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
    operator_delete((void *)local_270._0_8_);
  }
  if (_local_4a0 != local_490) {
    operator_delete(_local_4a0);
  }
  pcVar1 = *(pointer *)(local_468._0_8_ + 8);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_468._0_8_ + 0x10);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 1;
  local_290[1] = 2;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_2d8,
             (iterator)
             local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_290 + 1);
  std::vector<int,_std::allocator<int>_>::vector(&local_3e0,&local_2d8);
  local_4d4[0xc] = 3;
  if (local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_3e0,
               (iterator)
               local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4d4 + 0xc);
  }
  else {
    *local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_3c8,&local_3e0);
  local_4d4[0xb] = 0;
  if (local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_3c8,
               (iterator)
               local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4d4 + 0xb);
  }
  else {
    *local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_3b0,&local_3c8);
  local_4d4[10] = 3;
  if (local_3b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_3b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_3b0,
               (iterator)
               local_3b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4d4 + 10);
  }
  else {
    *local_3b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_3b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_3b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_398,&local_3b0);
  local_4d4[9] = 2;
  if (local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_398,
               (iterator)
               local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4d4 + 9);
  }
  else {
    *local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_380,&local_398);
  local_4d4[8] = 1;
  if (local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_380,
               (iterator)
               local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4d4 + 8);
  }
  else {
    *local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_368,&local_380);
  local_4d4[7] = 0;
  if (local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_368,
               (iterator)
               local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4d4 + 7);
  }
  else {
    *local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_350,&local_368);
  local_4d4[6] = 1;
  if (local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_350,
               (iterator)
               local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4d4 + 6);
  }
  else {
    *local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_338,&local_350);
  local_4d4[5] = 2;
  if (local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_338,
               (iterator)
               local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4d4 + 5);
  }
  else {
    *local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_2a8,&local_338);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_250._0_8_ = (pointer)0x0;
  local_250._8_8_ = (pointer)0x0;
  local_270._16_8_ = 0;
  local_270._24_8_ = (void *)0x0;
  local_250[0x10] = false;
  local_270._0_8_ = pcVar1;
  local_270._8_8_ = this_00;
  if (local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar5 = (uint *)local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      local_4a0 = (undefined1  [4])*puVar5;
      fStack_49c = 0.0;
      local_498 = 0.0;
      if (local_250._0_8_ == local_250._8_8_) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_270 + 0x18),(iterator)local_250._0_8_,(positioned_glyph *)local_4a0);
      }
      else {
        ((vector_r *)(local_250._0_8_ + 4))->dy = 0.0;
        *(ulong *)local_250._0_8_ = (ulong)(uint)local_4a0;
        local_250._0_8_ = local_250._0_8_ + 0xc;
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != (uint *)local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_1d8,1,(value_type *)local_270,(allocator_type *)local_4a0);
  ref_text_line::ref_text_line(&local_110,0.0,10.0,0.0,&local_1d8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_288,1,&local_110,(allocator_type *)local_4a0);
  uVar2 = *(undefined8 *)(local_468._0_8_ + 8);
  this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_468._0_8_ + 0x10);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 1;
  local_290[0] = 2;
  local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_2f8,
             (iterator)
             local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_290);
  std::vector<int,_std::allocator<int>_>::vector(&local_458,&local_2f8);
  local_4d4[4] = 2;
  if (local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_458,
               (iterator)
               local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4d4 + 4);
  }
  else {
    *local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_440,&local_458);
  local_4d4[3] = 0;
  if (local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_440,
               (iterator)
               local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4d4 + 3);
  }
  else {
    *local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_428,&local_440);
  local_4d4[2] = 2;
  if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_428,
               (iterator)
               local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4d4 + 2);
  }
  else {
    *local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_410,&local_428);
  local_4d4[1] = 2;
  if (local_410.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_410.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_410,
               (iterator)
               local_410.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4d4 + 1);
  }
  else {
    *local_410.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_410.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_410.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_3f8,&local_410);
  local_4d4[0] = 3;
  if (local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_3f8,
               (iterator)
               local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_4d4);
  }
  else {
    *local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_2c0,&local_3f8);
  local_4a0 = SUB84(uVar2,0);
  fStack_49c = (float)((ulong)uVar2 >> 0x20);
  local_498 = SUB84(this_01,0);
  uStack_494 = (undefined4)((ulong)this_01 >> 0x20);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_480._M_current = (positioned_glyph *)0x0;
  ppStack_478 = (positioned_glyph *)0x0;
  local_490._0_8_ = 0;
  local_490._8_8_ = (void *)0x0;
  local_470 = false;
  if (local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar5 = (uint *)local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      local_320 = (undefined1  [4])*puVar5;
      fStack_31c = 0.0;
      fStack_318 = 0.0;
      if (local_480._M_current == ppStack_478) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_490 + 8),local_480,(positioned_glyph *)local_320);
      }
      else {
        ((local_480._M_current)->d).dy = 0.0;
        (local_480._M_current)->index = (int)(ulong)(uint)local_320;
        ((local_480._M_current)->d).dx = (float)(int)((ulong)(uint)local_320 >> 0x20);
        local_480._M_current = local_480._M_current + 1;
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != (uint *)local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_1f0,1,(value_type *)local_4a0,(allocator_type *)local_320);
  ref_text_line::ref_text_line(&local_138,0.0,52.0,0.0,&local_1f0);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_288,&local_138);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_1c0,&local_288);
  std::vector<agge::text_line,std::allocator<agge::text_line>>::
  vector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>,void>
            ((vector<agge::text_line,std::allocator<agge::text_line>> *)&local_208,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_188._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_188._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)local_320);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_320,&local_1a8,0x15a);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_1c0,&local_208,(LocationInfo *)local_320);
  if ((undefined1 *)CONCAT44(fStack_31c,local_320) != local_310) {
    operator_delete((undefined1 *)CONCAT44(fStack_31c,local_320));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if (local_208.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_1c0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_138._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_1f0);
  if ((void *)local_490._8_8_ != (void *)0x0) {
    operator_delete((void *)local_490._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_494,local_498) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_494,local_498));
  }
  if ((uint *)local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_410.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_410.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_440.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_288);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_110._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_1d8);
  if ((void *)local_270._24_8_ != (void *)0x0) {
    operator_delete((void *)local_270._24_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._8_8_);
  }
  if ((uint *)local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_188._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_start != (text_line *)0x0) {
    operator_delete(local_188._text_lines.
                    super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&local_188._glyph_runs);
  if (local_188._glyphs._begin != (positioned_glyph *)0x0) {
    operator_delete__(local_188._glyphs._begin);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._8_8_);
  }
  lVar4 = 0x88;
  do {
    pvVar3 = *(void **)((long)&local_e8.outline.
                               super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar4);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3);
    }
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

test( TrivialLineFeedsDoNotProduceEmptyLines )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L' ', 0 }, { L'A', 1 }, { L'B', 2 }, { L'C', 3 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 7.1, 0 } },
					{ { 11, 0 } },
					{ { 13, 0 } },
					{ { 17, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);

				// ACT
				layout l;

				l.process(R("ABC CBA AB\n\n\nABB BBC\n\n"), limit::none(), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 2 + 3 + 0 + 3 + 2 + 1 + 0 + 1 + 2))
					+ ref_text_line(0.0f, 52.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 2 + 2 + 0 + 2 + 2 + 3)),
					mkvector(l.begin(), l.end()));
			}